

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_len(lua_State *L,int idx)

{
  TValue *rb;
  TValue *t;
  int idx_local;
  lua_State *L_local;
  
  rb = index2value(L,idx);
  luaV_objlen(L,(L->top).p,rb);
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return;
}

Assistant:

LUA_API void lua_len (lua_State *L, int idx) {
  TValue *t;
  lua_lock(L);
  t = index2value(L, idx);
  luaV_objlen(L, L->top.p, t);
  api_incr_top(L);
  lua_unlock(L);
}